

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O2

bool __thiscall
InliningDecider::DeciderInlineIntoInliner
          (InliningDecider *this,FunctionBody *inlinee,FunctionBody *inliner,bool isConstructorCall,
          bool isPolymorphicCall,uint16 constantArgInfo,uint recursiveInlineDepth,
          bool allowRecursiveInlining)

{
  uint32 uVar1;
  bool bVar2;
  uint uVar3;
  LocalFunctionId LVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  char16 *pcVar11;
  undefined4 extraout_var_00;
  char16 *pcVar12;
  undefined4 extraout_var_01;
  char16 *pcVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  DynamicProfileInfo *pDVar17;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  char16_t *form;
  wchar local_188 [4];
  char16 debugStringBuffer [42];
  wchar local_128 [4];
  char16 debugStringBuffer2 [42];
  wchar local_c8 [4];
  char16 debugStringBuffer3 [42];
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  bVar2 = CanRecursivelyInline(this,inlinee,inliner,allowRecursiveInlining,recursiveInlineDepth);
  if (!bVar2) {
    return false;
  }
  if ((((inliner->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 ^
       (inlinee->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46) & 2) != 0) {
    return false;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  if (uVar3 == 0xfffffffe) {
    return true;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlinePhase,uVar3,LVar4);
  if (bVar2) {
    return true;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlinePhase,uVar3,LVar4);
  if (bVar2) {
    return true;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlinePhase,uVar3,LVar4);
  if (bVar2) {
    return true;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar3,LVar4);
  if (bVar2) {
    return false;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar3,LVar4);
  if (bVar2) {
    return false;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlinePhase,uVar3,LVar4);
  if (bVar2) {
    return false;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlineTreePhase,uVar3,LVar4);
  if (bVar2) {
    return true;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlineTreePhase,uVar3,LVar4);
  if (bVar2) {
    return true;
  }
  uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
  LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlineAtEveryCallerPhase,uVar3,LVar4);
  if (bVar2) {
    return true;
  }
  uVar3 = Js::FunctionBody::GetByteCodeWithoutLDACount(inlinee);
  if (((inlinee->m_argUsedForBranch & constantArgInfo) != 0) && (uVar3 < DAT_0143eef0)) {
    return true;
  }
  uVar6 = (this->threshold).inlineThreshold;
  if (((((!isConstructorCall && !isPolymorphicCall) && (bVar2 = IsInlineeLeaf(inlinee), bVar2)) &&
       (uVar5 = Js::FunctionBody::GetLoopCount(inlinee), uVar5 < 3)) &&
      ((uVar5 = Js::FunctionBody::GetLoopCount(inlinee), uVar5 == 0 ||
       (this->numberOfInlineesWithLoop <= (uint)(this->threshold).maxNumberOfInlineesWithLoop)))) &&
     (iVar7 = (this->threshold).leafInlineThreshold, -1 < iVar7)) {
    uVar6 = (iVar7 + uVar6) - (this->threshold).inlineThreshold;
  }
  bVar2 = Js::FunctionBody::GetHasLoops(inlinee);
  if (bVar2) {
    if (((-1 < (this->threshold).loopInlineThreshold) &&
        (this->numberOfInlineesWithLoop <= (uint)(this->threshold).maxNumberOfInlineesWithLoop)) &&
       ((uVar5 = Js::FunctionBody::GetLoopCount(inlinee), uVar5 < 3 &&
        (((inlinee->field_0x17a | isConstructorCall) & 1) == 0)))) {
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar2 = Js::Phases::IsEnabled
                        ((Phases *)&DAT_01441eb0,InlineFunctionsWithLoopsPhase,uVar5,LVar4);
      if (!bVar2) {
        iVar7 = (this->threshold).loopInlineThreshold;
        iVar8 = (this->threshold).inlineThreshold;
        iVar9 = iVar7 - iVar8;
        if (iVar8 <= iVar7) {
          iVar9 = 0;
        }
        uVar6 = uVar6 + iVar9;
        goto LAB_00512310;
      }
    }
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar3,LVar4);
    if (!bVar2) {
      return false;
    }
    uVar3 = Js::FunctionBody::GetByteCodeCount(inlinee);
    uVar1 = this->numberOfInlineesWithLoop;
    uVar5 = Js::FunctionBody::GetLoopCount(inlinee);
    uVar6 = *(uint *)&inlinee->field_0x178;
    iVar7 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inlinee,(wchar (*) [42])local_188);
    iVar8 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
    iVar9 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      ();
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_c8);
    Output::Print(L"INLINING: Skip Inline: Has loops \tBytecode size: %d \tgetNumberOfInlineesWithLoop: %d\tloopCount: %d\thasNestedLoop: %d\tisConstructorCall:%d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
                  ,(ulong)uVar3,uVar1,(ulong)uVar5,(ulong)(uVar6 >> 0x10 & 1),
                  (ulong)isConstructorCall,CONCAT44(extraout_var,iVar7),pcVar11,
                  CONCAT44(extraout_var_00,iVar8),pcVar12,CONCAT44(extraout_var_01,iVar9),pcVar13);
    goto LAB_005126cc;
  }
LAB_00512310:
  if (isPolymorphicCall) {
    iVar7 = (this->threshold).polymorphicInlineThreshold;
    if (-1 < iVar7 && !isConstructorCall) {
      iVar8 = (this->threshold).inlineThreshold;
      iVar9 = iVar7 - iVar8;
      if (iVar8 <= iVar7) {
        iVar9 = 0;
      }
      uVar6 = uVar6 + iVar9;
      goto LAB_00512419;
    }
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar3,LVar4);
    if (!bVar2) {
      return false;
    }
    uVar10 = (this->threshold).polymorphicInlineThreshold;
    uVar6 = Js::FunctionBody::GetByteCodeCount(inlinee);
    iVar7 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    uVar14 = CONCAT44(extraout_var_02,iVar7);
    pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inlinee,(wchar (*) [42])local_188);
    iVar7 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    uVar15 = CONCAT44(extraout_var_03,iVar7);
    pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
    iVar7 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      ();
    uVar16 = CONCAT44(extraout_var_04,iVar7);
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_c8);
    form = 
    L"INLINING: Skip Inline: Polymorphic call under PolymorphicInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
    ;
  }
  else {
LAB_00512419:
    if (isConstructorCall) {
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineConstructorsPhase,uVar5,LVar4);
      if (bVar2) {
        return false;
      }
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineConstructorsPhase,uVar5,LVar4);
      if (bVar2) {
        return false;
      }
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,InlineConstructorsPhase,uVar5,LVar4);
      if (bVar2) {
        return false;
      }
      if (DAT_014303d9 != '\x01') {
        return false;
      }
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlineConstructorsPhase,uVar5,LVar4);
      if (bVar2) {
        return true;
      }
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inliner);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inliner);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlineConstructorsPhase,uVar5,LVar4);
      if (bVar2) {
        return true;
      }
      uVar5 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)inlinee);
      LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)inlinee);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01436260,InlineConstructorsPhase,uVar5,LVar4);
      if (bVar2) {
        return true;
      }
      if (((inlinee->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) &&
         (pDVar17 = Js::FunctionBody::GetAnyDynamicProfileInfo(inlinee),
         ((pDVar17->bits).field_0x3 & 4) != 0)) {
        return true;
      }
      iVar7 = (this->threshold).constructorInlineThreshold;
      if (iVar7 < 0) {
        uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
        LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
        bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar3,LVar4);
        if (!bVar2) {
          return false;
        }
        uVar3 = Js::FunctionBody::GetByteCodeCount(inlinee);
        iVar7 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
        pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)inlinee,(wchar (*) [42])local_188);
        iVar8 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject
                  .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
        pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
        iVar9 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [7])();
        pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                            ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_c8);
        Output::Print(L"INLINING: Skip Inline: Constructor with no polymorphic field access \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
                      ,(ulong)uVar3,CONCAT44(extraout_var_08,iVar7),pcVar11,
                      CONCAT44(extraout_var_09,iVar8),pcVar12,CONCAT44(extraout_var_10,iVar9),
                      pcVar13);
        goto LAB_005126cc;
      }
      iVar8 = (this->threshold).inlineThreshold;
      iVar9 = iVar7 - iVar8;
      if (iVar8 <= iVar7) {
        iVar9 = 0;
      }
      uVar6 = uVar6 + iVar9;
    }
    if ((this->threshold).forLoopBody == true) {
      uVar6 = (int)uVar6 / DAT_0143c00c;
    }
    if (uVar3 <= uVar6 && 0 < (int)uVar6) {
      uVar3 = Js::FunctionBody::GetLoopCount(inlinee);
      if (uVar3 != 0) {
        this->numberOfInlineesWithLoop = this->numberOfInlineesWithLoop + 1;
        return true;
      }
      return true;
    }
    uVar3 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->topFunc);
    LVar4 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->topFunc);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_014594b0,InlinePhase,uVar3,LVar4);
    if (!bVar2) {
      return false;
    }
    uVar10 = Js::FunctionBody::GetByteCodeCount(inlinee);
    iVar7 = (*(inlinee->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inlinee);
    uVar14 = CONCAT44(extraout_var_05,iVar7);
    pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inlinee,(wchar (*) [42])local_188);
    iVar7 = (*(inliner->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(inliner);
    uVar15 = CONCAT44(extraout_var_06,iVar7);
    pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)inliner,(wchar (*) [42])local_128);
    iVar7 = (*(this->topFunc->super_ParseableFunctionInfo).super_FunctionProxy.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                      ();
    uVar16 = CONCAT44(extraout_var_07,iVar7);
    pcVar13 = Js::FunctionProxy::GetDebugNumberSet
                        ((FunctionProxy *)this->topFunc,(wchar (*) [42])local_c8);
    form = 
    L"INLINING: Skip Inline: Too long \tBytecode size: %d\tThreshold: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"
    ;
  }
  Output::Print(form,(ulong)uVar10,(ulong)uVar6,uVar14,pcVar11,uVar15,pcVar12,uVar16,pcVar13);
LAB_005126cc:
  Output::Flush();
  return false;
}

Assistant:

bool InliningDecider::DeciderInlineIntoInliner(Js::FunctionBody * inlinee, Js::FunctionBody * inliner, bool isConstructorCall, bool isPolymorphicCall, uint16 constantArgInfo, uint recursiveInlineDepth, bool allowRecursiveInlining)
{

    if (!CanRecursivelyInline(inlinee, inliner, allowRecursiveInlining, recursiveInlineDepth))
    {
        return false;
    }

    if (inliner->GetIsAsmjsMode() != inlinee->GetIsAsmjsMode())
    {
        return false;
    }
// Force inline all Js Builtins functions
// The existing JsBuiltInForceInline flag can work only when we explictly create scriptFunction
// We can also have methods that we define on the prototype like next of ArrayIterator for which we don't explictly create a script function
// TODO (megupta) : use forceInline for methods defined on the prototype using ObjectDefineProperty
    if (inlinee->GetSourceContextId() == Js::Constants::JsBuiltInSourceContextId ||
        PHASE_FORCE(Js::InlinePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlinePhase, inliner) ||
        PHASE_FORCE(Js::InlinePhase, inlinee))
    {
        return true;
    }

    if (PHASE_OFF(Js::InlinePhase, this->topFunc) ||
        PHASE_OFF(Js::InlinePhase, inliner) ||
        PHASE_OFF(Js::InlinePhase, inlinee))
    {
        return false;
    }

    if (PHASE_FORCE(Js::InlineTreePhase, this->topFunc) ||
        PHASE_FORCE(Js::InlineTreePhase, inliner))
    {
        return true;
    }

    if (PHASE_FORCE(Js::InlineAtEveryCallerPhase, inlinee))
    {
        return true;
    }

    uint inlineeByteCodeCount = inlinee->GetByteCodeWithoutLDACount();

    // Heuristics are hit in the following order (Note *order* is important)
    // 1. Leaf function:  If the inlinee is a leaf (but not a constructor or a polymorphic call) inline threshold is LeafInlineThreshold (60). Also it can have max 1 loop
    // 2. Constant Function Argument: If the inlinee candidate has a constant argument and that argument is used for branching, then the inline threshold is ConstantArgumentInlineThreshold (157)
    // 3. InlineThreshold: If an inlinee candidate exceeds InlineThreshold just don't inline no matter what.

    // Following are additional constraint for an inlinee which meets InlineThreshold (Rule no 3)
    // 4. Rule for inlinee with loops:
    //      4a. Only single loop in inlinee is permitted.
    //      4b. Should not have polymorphic field access.
    //      4c. Should not be a constructor.
    //      4d. Should meet LoopInlineThreshold (25)
    // 5. Rule for polymorphic inlinee:
    //      4a. Should meet PolymorphicInlineThreshold (32)
    // 6. Rule for constructors:
    //       5a. Always inline if inlinee has polymorphic field access (as we have cloned runtime data).
    //       5b. If inlinee is monomorphic, inline only small constructors. They are governed by ConstructorInlineThreshold (21)
    // 7. Rule for inlinee which is not interpreted enough (as we might not have all the profile data):
    //       7a. As of now it is still governed by the InlineThreshold. Plan to play with this in future.
    // 8. Rest should be inlined.

    uint16 mask = constantArgInfo &  inlinee->m_argUsedForBranch;
    if (mask && inlineeByteCodeCount <  (uint)CONFIG_FLAG(ConstantArgumentInlineThreshold))
    {
        return true;
    }

    int inlineThreshold = threshold.inlineThreshold;
    if (!isPolymorphicCall && !isConstructorCall && IsInlineeLeaf(inlinee) && (inlinee->GetLoopCount() <= 2))
    {
        // Inlinee is a leaf function
        if (inlinee->GetLoopCount() == 0 || GetNumberOfInlineesWithLoop() <= (uint)threshold.maxNumberOfInlineesWithLoop) // Don't inlinee too many inlinees with loops.
        {
            // Negative LeafInlineThreshold disable the threshold
            if (threshold.leafInlineThreshold >= 0)
            {
                inlineThreshold += threshold.leafInlineThreshold - threshold.inlineThreshold;
            }
        }
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

    if (inlinee->GetHasLoops())
    {
        if (threshold.loopInlineThreshold < 0 ||                                     // Negative LoopInlineThreshold disable inlining with loop
            GetNumberOfInlineesWithLoop()  >(uint)threshold.maxNumberOfInlineesWithLoop || // See if we are inlining too many inlinees with loops.
            (inlinee->GetLoopCount() > 2) ||                                         // Allow at most 2 loops.
            inlinee->GetHasNestedLoop() ||                                           // Nested loops are not a good inlinee candidate
            isConstructorCall ||                                                     // If the function is constructor with loops, don't inline.
            PHASE_OFF(Js::InlineFunctionsWithLoopsPhase, this->topFunc))
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Has loops \tBytecode size: %d \tgetNumberOfInlineesWithLoop: %d\tloopCount: %d\thasNestedLoop: %d\tisConstructorCall:%d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                inlinee->GetByteCodeCount(),
                GetNumberOfInlineesWithLoop(),
                inlinee->GetLoopCount(),
                inlinee->GetHasNestedLoop(),
                isConstructorCall,
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            // Don't inline function with loops
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.loopInlineThreshold) ? threshold.inlineThreshold - threshold.loopInlineThreshold : 0;
        }
    }

    if (isPolymorphicCall)
    {
        if (threshold.polymorphicInlineThreshold < 0 ||                              // Negative PolymorphicInlineThreshold disable inlining
            isConstructorCall)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Polymorphic call under PolymorphicInlineThreshold: %d \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                threshold.polymorphicInlineThreshold,
                inlinee->GetByteCodeCount(),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.polymorphicInlineThreshold) ? threshold.inlineThreshold - threshold.polymorphicInlineThreshold : 0;
        }
    }

    if (isConstructorCall)
    {
#pragma prefast(suppress: 6285, "logical-or of constants is by design")
        if (PHASE_OFF(Js::InlineConstructorsPhase, this->topFunc) ||
            PHASE_OFF(Js::InlineConstructorsPhase, inliner) ||
            PHASE_OFF(Js::InlineConstructorsPhase, inlinee) ||
            !CONFIG_FLAG(CloneInlinedPolymorphicCaches))
        {
            return false;
        }

        if (PHASE_FORCE(Js::InlineConstructorsPhase, this->topFunc) ||
            PHASE_FORCE(Js::InlineConstructorsPhase, inliner) ||
            PHASE_FORCE(Js::InlineConstructorsPhase, inlinee))
        {
            return true;
        }

        if (inlinee->HasDynamicProfileInfo() && inlinee->GetAnyDynamicProfileInfo()->HasPolymorphicFldAccess())
        {
            // As of now this is not dependent on bytecodeInlinedThreshold.
            return true;
        }

        // Negative ConstructorInlineThreshold always disable constructor inlining
        if (threshold.constructorInlineThreshold < 0)
        {
            INLINE_TESTTRACE(_u("INLINING: Skip Inline: Constructor with no polymorphic field access \tBytecode size: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
                inlinee->GetByteCodeCount(),
                inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
                inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
                topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
            // Don't inline constructor that does not have a polymorphic field access, or if cloning polymorphic inline
            // caches is disabled
            return false;
        }
        else
        {
            inlineThreshold -= (threshold.inlineThreshold > threshold.constructorInlineThreshold) ? threshold.inlineThreshold - threshold.constructorInlineThreshold : 0;
        }
    }

    if (threshold.forLoopBody)
    {
        inlineThreshold /= CONFIG_FLAG(InlineInLoopBodyScaleDownFactor);
    }

    if (inlineThreshold > 0 && inlineeByteCodeCount <= (uint)inlineThreshold)
    {
        if (inlinee->GetLoopCount())
        {
            IncrementNumberOfInlineesWithLoop();
        }
        return true;
    }
    else
    {
        INLINE_TESTTRACE(_u("INLINING: Skip Inline: Too long \tBytecode size: %d\tThreshold: %d\tInlinee: %s (%s)\tCaller: %s (%s) \tRoot: %s (%s)\n"),
            inlinee->GetByteCodeCount(),
            inlineThreshold,
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2),
            topFunc->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3));
        return false;
    }
}